

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_17d44::BuildSystemFrontendDelegateImpl::BuildSystemFrontendDelegateImpl
          (BuildSystemFrontendDelegateImpl *this,SourceMgr *sourceMgr)

{
  SourceMgr *sourceMgr_local;
  BuildSystemFrontendDelegateImpl *this_local;
  
  this->sourceMgr = sourceMgr;
  llvm::StringRef::StringRef(&this->bufferBeingParsed);
  std::atomic<unsigned_int>::atomic(&this->numErrors,0);
  std::atomic<unsigned_int>::atomic(&this->numFailedCommands,0);
  BuildSystemFrontendExecutionQueueDelegate::BuildSystemFrontendExecutionQueueDelegate
            (&this->executionQueueDelegate,this);
  this->frontend = (BuildSystemFrontendImpl *)0x0;
  llvm::
  DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::DenseMap(&this->processOutputBuffers,0);
  std::mutex::mutex(&this->processOutputBuffersMutex);
  return;
}

Assistant:

BuildSystemFrontendDelegateImpl(llvm::SourceMgr& sourceMgr)
      : sourceMgr(sourceMgr), executionQueueDelegate(*this) {}